

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLexicalAnalyzer.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  bool bVar5;
  ifstream fin;
  undefined1 local_238 [520];
  
  if (argc == 1) {
    iVar1 = analyze();
    return iVar1;
  }
  iVar1 = 0;
  if (1 < argc) {
    lVar3 = 0;
    iVar4 = 0;
    do {
      std::ifstream::ifstream(local_238,argv[lVar3 + 1],_S_in);
      std::ios::rdbuf((streambuf *)((long)&std::cin + *(long *)(std::cin + -0x18)));
      iVar2 = analyze();
      iVar1 = iVar2;
      if (iVar2 < 1) {
        std::ifstream::close();
        std::ios::rdbuf((streambuf *)((long)&std::cin + *(long *)(std::cin + -0x18)));
        iVar1 = iVar4;
      }
      std::ifstream::~ifstream(local_238);
    } while ((iVar2 < 1) &&
            (bVar5 = (ulong)(uint)argc - 2 != lVar3, lVar3 = lVar3 + 1, iVar4 = iVar1, bVar5));
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc == 1)
        return analyze();
    else
        for (int i = 1; i < argc; i++)
        {
            std::ifstream fin(argv[i]);
            auto cinBuf = std::cin.rdbuf(fin.rdbuf());
            int code = analyze();
            if (code > 0)
                return code;
            fin.close();
            std::cin.rdbuf(cinBuf);
        }
}